

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O2

ScopeCtx *
wasm::IRBuilder::ScopeCtx::makeCatchAll(ScopeCtx *__return_storage_ptr__,ScopeCtx *scope,Try *tryy)

{
  pointer ppEVar1;
  CatchAllScope local_38;
  
  local_38.tryy = tryy;
  local_38.originalLabel = getOriginalLabel(scope);
  std::
  variant<wasm::IRBuilder::ScopeCtx::NoScope,wasm::IRBuilder::ScopeCtx::FuncScope,wasm::IRBuilder::ScopeCtx::BlockScope,wasm::IRBuilder::ScopeCtx::IfScope,wasm::IRBuilder::ScopeCtx::ElseScope,wasm::IRBuilder::ScopeCtx::LoopScope,wasm::IRBuilder::ScopeCtx::TryScope,wasm::IRBuilder::ScopeCtx::CatchScope,wasm::IRBuilder::ScopeCtx::CatchAllScope,wasm::IRBuilder::ScopeCtx::TryTableScope>
  ::operator=((variant<wasm::IRBuilder::ScopeCtx::NoScope,wasm::IRBuilder::ScopeCtx::FuncScope,wasm::IRBuilder::ScopeCtx::BlockScope,wasm::IRBuilder::ScopeCtx::IfScope,wasm::IRBuilder::ScopeCtx::ElseScope,wasm::IRBuilder::ScopeCtx::LoopScope,wasm::IRBuilder::ScopeCtx::TryScope,wasm::IRBuilder::ScopeCtx::CatchScope,wasm::IRBuilder::ScopeCtx::CatchAllScope,wasm::IRBuilder::ScopeCtx::TryTableScope>
               *)scope,&local_38);
  ppEVar1 = (scope->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((scope->exprStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar1) {
    (scope->exprStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppEVar1;
  }
  scope->unreachable = false;
  (scope->inputType).id = 0;
  scope->inputLocal = 0xffffffff;
  ScopeCtx(__return_storage_ptr__,scope);
  return __return_storage_ptr__;
}

Assistant:

static ScopeCtx makeCatchAll(ScopeCtx&& scope, Try* tryy) {
      scope.scope = CatchAllScope{tryy, scope.getOriginalLabel()};
      scope.resetForDelimiter(/*keepInput=*/false);
      return scope;
    }